

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

uint stb_hashptr(void *p)

{
  int iVar1;
  uint uVar2;
  uint x;
  void *p_local;
  
  uVar2 = (uint)p;
  iVar1 = uVar2 + (uVar2 >> 6) + (uVar2 >> 0x13);
  uVar2 = iVar1 * 0x80008 ^ iVar1 * 0x10001;
  uVar2 = (uVar2 >> 5) + uVar2;
  uVar2 = uVar2 * 4 ^ uVar2;
  uVar2 = (uVar2 >> 0xf) + uVar2;
  uVar2 = uVar2 * 0x400 ^ uVar2;
  return uVar2 + (uVar2 >> 6) + (uVar2 >> 0x13);
}

Assistant:

unsigned int stb_hashptr(void *p)
{
   unsigned int x = (unsigned int) p;

   // typically lacking in low bits and high bits
   x = stb_rehash(x);
   x += x << 16;

   // pearson's shuffle
   x ^= x << 3;
   x += x >> 5;
   x ^= x << 2;
   x += x >> 15;
   x ^= x << 10;
   return stb_rehash(x);
}